

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall
QWidgetRepaintManager::addDirtyWidget(QWidgetRepaintManager *this,QWidget *widget,QRegion *rgn)

{
  QWidgetPrivate *this_00;
  QRegionData *pQVar1;
  QRect QVar2;
  QRect QVar3;
  QWidgetPrivate *widgetPrivate;
  long in_FS_OFFSET;
  QRect local_50;
  QRect local_40;
  QRegion local_30;
  long local_28;
  
  QVar3._8_8_ = local_50._8_8_;
  QVar3._0_8_ = local_50._0_8_;
  QVar2._8_8_ = local_50._8_8_;
  QVar2._0_8_ = local_50._0_8_;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((widget != (QWidget *)0x0) &&
      (this_00 = *(QWidgetPrivate **)&widget->field_0x8, local_50 = QVar2,
      (this_00->field_0x252 & 8) == 0)) && (local_50 = QVar3, (widget->data->field_0x12 & 4) == 0))
  {
    if (this_00->graphicsEffect == (QGraphicsEffect *)0x0) {
      QRegion::operator=(&this_00->dirty,rgn);
    }
    else {
      local_50 = (QRect)QRegion::boundingRect();
      local_40 = QWidgetPrivate::effectiveRectFor(this_00,&local_50);
      QRegion::QRegion(&local_30,&local_40,Rectangle);
      pQVar1 = (this_00->dirty).d;
      (this_00->dirty).d = local_30.d;
      local_30.d = pQVar1;
      QRegion::~QRegion(&local_30);
    }
    QList<QWidget_*>::append((QList<QWidget_*> *)(this + 0x18),widget);
    this_00->field_0x252 = this_00->field_0x252 | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::addDirtyWidget(QWidget *widget, const QRegion &rgn)
{
    if (widget && !widget->d_func()->inDirtyList && !widget->data->in_destructor) {
        QWidgetPrivate *widgetPrivate = widget->d_func();
#if QT_CONFIG(graphicseffect)
        if (widgetPrivate->graphicsEffect)
            widgetPrivate->dirty = widgetPrivate->effectiveRectFor(rgn.boundingRect());
        else
#endif // QT_CONFIG(graphicseffect)
            widgetPrivate->dirty = rgn;
        dirtyWidgets.append(widget);
        widgetPrivate->inDirtyList = true;
    }
}